

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

lbool sat_solver_search(sat_solver *s,ABC_INT64_T nof_conflicts)

{
  float random_var_freq_00;
  int iVar1;
  int iVar2;
  lit lVar3;
  int *piVar4;
  abctime aVar5;
  double dVar6;
  int local_7c;
  int local_70;
  int local_54;
  int i_1;
  int next;
  int blevel;
  int hConfl;
  int i;
  veci learnt_clause;
  ABC_INT64_T conflictC;
  double random_var_freq;
  ABC_INT64_T nof_conflicts_local;
  sat_solver *s_local;
  
  random_var_freq_00 = 0.0;
  if (s->fNotUseRandom == 0) {
    random_var_freq_00 = 0.02;
  }
  learnt_clause.ptr = (int *)0x0;
  iVar2 = s->root_level;
  iVar1 = sat_solver_dl(s);
  if (iVar2 != iVar1) {
    __assert_fail("s->root_level == sat_solver_dl(s)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.c"
                  ,0x646,"lbool sat_solver_search(sat_solver *, ABC_INT64_T)");
  }
  s->nRestarts = s->nRestarts + 1;
  (s->stats).starts = (s->stats).starts + 1;
  veci_new((veci *)&hConfl);
  if (((s->nRestarts & 1U) != 0) && (iVar2 = veci_size(&s->act_vars), 0 < iVar2)) {
    for (blevel = 0; blevel < (s->act_vars).size; blevel = blevel + 1) {
      act_var_bump_factor(s,(s->act_vars).ptr[blevel]);
    }
  }
  if ((s->pGlobalVars != (int *)0x0) && (iVar2 = veci_size(&s->act_vars), 0 < iVar2)) {
    for (blevel = 0; blevel < (s->act_vars).size; blevel = blevel + 1) {
      act_var_bump_global(s,(s->act_vars).ptr[blevel]);
    }
  }
  while( true ) {
    while (iVar2 = sat_solver_propagate(s), iVar2 != 0) {
      (s->stats).conflicts = (s->stats).conflicts + 1;
      learnt_clause.ptr = (int *)((long)learnt_clause.ptr + 1);
      iVar1 = sat_solver_dl(s);
      if (iVar1 == s->root_level) {
        sat_solver_analyze_final(s,iVar2,0);
        veci_delete((veci *)&hConfl);
        return -1;
      }
      veci_resize((veci *)&hConfl,0);
      sat_solver_analyze(s,iVar2,(veci *)&hConfl);
      iVar2 = veci_size((veci *)&hConfl);
      if (iVar2 < 2) {
        local_70 = s->root_level;
      }
      else {
        piVar4 = veci_begin((veci *)&hConfl);
        iVar2 = lit_var(piVar4[1]);
        local_70 = var_level(s,iVar2);
      }
      if (local_70 < s->root_level) {
        local_7c = s->root_level;
      }
      else {
        local_7c = local_70;
      }
      sat_solver_canceluntil(s,local_7c);
      sat_solver_record(s,(veci *)&hConfl);
      if (i == 1) {
        iVar2 = lit_var(*(lit *)learnt_clause._0_8_);
        var_set_level(s,iVar2,0);
      }
      act_var_decay(s);
      act_clause_decay(s);
    }
    if ((((s->fNoRestarts == 0) && (-1 < nof_conflicts)) &&
        (nof_conflicts <= (long)learnt_clause.ptr)) ||
       (((s->nRuntimeLimit != 0 && (((s->stats).conflicts & 0x3fU) == 0)) &&
        (aVar5 = Abc_Clock(), s->nRuntimeLimit < aVar5)))) {
      dVar6 = sat_solver_progress(s);
      s->progress_estimate = dVar6;
      sat_solver_canceluntil(s,s->root_level);
      veci_delete((veci *)&hConfl);
      return '\0';
    }
    if (((s->nConfLimit != 0) && (s->nConfLimit < (s->stats).conflicts)) ||
       ((s->nInsLimit != 0 && (s->nInsLimit < (s->stats).propagations)))) {
      dVar6 = sat_solver_progress(s);
      s->progress_estimate = dVar6;
      sat_solver_canceluntil(s,s->root_level);
      veci_delete((veci *)&hConfl);
      return '\0';
    }
    iVar2 = sat_solver_dl(s);
    if ((iVar2 == 0) && (s->fSkipSimplify == 0)) {
      sat_solver_simplify(s);
    }
    if ((s->nLearntMax != 0) && (iVar2 = veci_size(&s->act_clas), s->nLearntMax <= iVar2)) {
      sat_solver_reducedb(s);
    }
    (s->stats).decisions = (s->stats).decisions + 1;
    iVar2 = order_select(s,random_var_freq_00);
    if (iVar2 == -1) break;
    iVar1 = var_polar(s,iVar2);
    if (iVar1 == 0) {
      lVar3 = toLit(iVar2);
      lVar3 = lit_neg(lVar3);
      sat_solver_decision(s,lVar3);
    }
    else {
      lVar3 = toLit(iVar2);
      sat_solver_decision(s,lVar3);
    }
  }
  for (local_54 = 0; local_54 < s->size; local_54 = local_54 + 1) {
    iVar1 = var_value(s,local_54);
    iVar2 = -1;
    if (iVar1 == 0) {
      iVar2 = 1;
    }
    s->model[local_54] = iVar2;
  }
  sat_solver_canceluntil(s,s->root_level);
  veci_delete((veci *)&hConfl);
  return '\x01';
}

Assistant:

static lbool sat_solver_search(sat_solver* s, ABC_INT64_T nof_conflicts)
{
//    double  var_decay       = 0.95;
//    double  clause_decay    = 0.999;
    double  random_var_freq = s->fNotUseRandom ? 0.0 : 0.02;
    ABC_INT64_T  conflictC  = 0;
    veci    learnt_clause;
    int     i;

    assert(s->root_level == sat_solver_dl(s));

    s->nRestarts++;
    s->stats.starts++;
//    s->var_decay = (float)(1 / var_decay   );  // move this to sat_solver_new()
//    s->cla_decay = (float)(1 / clause_decay);  // move this to sat_solver_new()
//    veci_resize(&s->model,0);
    veci_new(&learnt_clause);

    // use activity factors in every even restart
    if ( (s->nRestarts & 1) && veci_size(&s->act_vars) > 0 )
//    if ( veci_size(&s->act_vars) > 0 )
        for ( i = 0; i < s->act_vars.size; i++ )
            act_var_bump_factor(s, s->act_vars.ptr[i]);

    // use activity factors in every restart
    if ( s->pGlobalVars && veci_size(&s->act_vars) > 0 )
        for ( i = 0; i < s->act_vars.size; i++ )
            act_var_bump_global(s, s->act_vars.ptr[i]);

    for (;;){
        int hConfl = sat_solver_propagate(s);
        if (hConfl != 0){
            // CONFLICT
            int blevel;

#ifdef VERBOSEDEBUG
            printf(L_IND"**CONFLICT**\n", L_ind);
#endif
            s->stats.conflicts++; conflictC++;
            if (sat_solver_dl(s) == s->root_level){
#ifdef SAT_USE_ANALYZE_FINAL
                sat_solver_analyze_final(s, hConfl, 0);
#endif
                veci_delete(&learnt_clause);
                return l_False;
            }

            veci_resize(&learnt_clause,0);
            sat_solver_analyze(s, hConfl, &learnt_clause);
            blevel = veci_size(&learnt_clause) > 1 ? var_level(s, lit_var(veci_begin(&learnt_clause)[1])) : s->root_level;
            blevel = s->root_level > blevel ? s->root_level : blevel;
            sat_solver_canceluntil(s,blevel);
            sat_solver_record(s,&learnt_clause);
#ifdef SAT_USE_ANALYZE_FINAL
//            if (learnt_clause.size() == 1) level[var(learnt_clause[0])] = 0;    // (this is ugly (but needed for 'analyzeFinal()') -- in future versions, we will backtrack past the 'root_level' and redo the assumptions)
            if ( learnt_clause.size == 1 ) 
                var_set_level(s, lit_var(learnt_clause.ptr[0]), 0);
#endif
            act_var_decay(s);
            act_clause_decay(s);

        }else{
            // NO CONFLICT
            int next;

            // Reached bound on number of conflicts:
            if ( (!s->fNoRestarts && nof_conflicts >= 0 && conflictC >= nof_conflicts) || (s->nRuntimeLimit && (s->stats.conflicts & 63) == 0 && Abc_Clock() > s->nRuntimeLimit)){
                s->progress_estimate = sat_solver_progress(s);
                sat_solver_canceluntil(s,s->root_level);
                veci_delete(&learnt_clause);
                return l_Undef; }

            // Reached bound on number of conflicts:
            if ( (s->nConfLimit && s->stats.conflicts > s->nConfLimit) ||
                 (s->nInsLimit  && s->stats.propagations > s->nInsLimit) )
            {
                s->progress_estimate = sat_solver_progress(s);
                sat_solver_canceluntil(s,s->root_level);
                veci_delete(&learnt_clause);
                return l_Undef; 
            }

            // Simplify the set of problem clauses:
            if (sat_solver_dl(s) == 0 && !s->fSkipSimplify)
                sat_solver_simplify(s);

            // Reduce the set of learnt clauses:
//            if (s->nLearntMax && veci_size(&s->learned) - s->qtail >= s->nLearntMax)
            if (s->nLearntMax && veci_size(&s->act_clas) >= s->nLearntMax)
                sat_solver_reducedb(s);

            // New variable decision:
            s->stats.decisions++;
            next = order_select(s,(float)random_var_freq);

            if (next == var_Undef){
                // Model found:
                int i;
                for (i = 0; i < s->size; i++)
                    s->model[i] = (var_value(s,i)==var1 ? l_True : l_False);
                sat_solver_canceluntil(s,s->root_level);
                veci_delete(&learnt_clause);

                /*
                veci apa; veci_new(&apa);
                for (i = 0; i < s->size; i++) 
                    veci_push(&apa,(int)(s->model.ptr[i] == l_True ? toLit(i) : lit_neg(toLit(i))));
                printf("model: "); printlits((lit*)apa.ptr, (lit*)apa.ptr + veci_size(&apa)); printf("\n");
                veci_delete(&apa);
                */

                return l_True;
            }

            if ( var_polar(s, next) ) // positive polarity
                sat_solver_decision(s,toLit(next));
            else
                sat_solver_decision(s,lit_neg(toLit(next)));
        }
    }

    return l_Undef; // cannot happen
}